

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::Test<short,2,false>
          (BufferTest *this,bool use_range_version)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  bVar1 = PrepareFramebuffer(this,0x8239);
  if (bVar1) {
    bVar1 = CreateBufferTexture<short,2,false>(this,use_range_version);
    if (bVar1) {
      Draw(this);
      bVar1 = Check<short,2,false>(this);
      CleanFramebuffer(this);
      CleanBufferTexture(this);
      iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      do {
        iVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      } while (iVar3 != 0);
    }
    else {
      CleanFramebuffer(this);
      iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      do {
        iVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x800))();
      } while (iVar3 != 0);
      bVar1 = false;
    }
  }
  else {
    CleanFramebuffer(this);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    do {
      iVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    } while (iVar3 != 0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool BufferTest::Test(bool use_range_version)
{
	/* Setup. */
	if (!PrepareFramebuffer(InternalFormat<T, S, N>()))
	{
		/**
                 * If the framebuffer it not supported, means that the
                 * tested combination is unsupported for this driver,
                 * but allowed to be unsupported by OpenGL spec, so we
                 * just skip.
                 */
		CleanFramebuffer();
		CleanErrors();

		return true;
	}

	if (!CreateBufferTexture<T, S, N>(use_range_version))
	{
		CleanFramebuffer();
		CleanErrors();

		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N>();

	/* Cleanup. */
	CleanFramebuffer();
	CleanBufferTexture();
	CleanErrors();

	/* Pass result. */
	return result;
}